

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathMatrix3.cpp
# Opt level: O1

void __thiscall
COLLADABU::Math::Matrix3::fromEulerAnglesXZY
          (Matrix3 *this,Real *fYAngle_radian,Real *fPAngle_radian,Real *fRAngle_radian)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  Real *pRVar5;
  long lVar6;
  size_t iRow;
  long lVar7;
  byte bVar8;
  Matrix3 kProd;
  Matrix3 kProd_1;
  double local_190 [3];
  undefined8 local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined8 local_168;
  double local_160 [21];
  double local_b8 [6];
  double adStack_88 [3];
  Real local_70 [9];
  
  bVar8 = 0;
  dVar3 = cos(*fYAngle_radian);
  local_160[0x13] = sin(*fYAngle_radian);
  local_160[0x11] = -local_160[0x13];
  local_160[0xc] = 1.0;
  local_160[0xd] = 0.0;
  local_160[0xe] = 0.0;
  lVar7 = 0;
  local_160[0xf] = 0.0;
  local_160[0x12] = 0.0;
  local_160[0x10] = dVar3;
  local_160[0x14] = dVar3;
  dVar3 = cos(*fPAngle_radian);
  local_160[6] = sin(*fPAngle_radian);
  local_160[4] = -local_160[6];
  local_160[5] = 0.0;
  local_160[8] = 0.0;
  local_160[9] = 0.0;
  local_160[10] = 0.0;
  local_160[0xb] = 1.0;
  local_160[3] = dVar3;
  local_160[7] = dVar3;
  dVar3 = cos(*fRAngle_radian);
  local_190[2] = sin(*fRAngle_radian);
  local_190[0] = dVar3;
  local_190[1] = 0.0;
  local_178._0_4_ = 0;
  local_178._4_4_ = 0;
  uStack_170 = 0;
  uStack_16c = 0x3ff00000;
  local_168 = 0;
  local_160[0] = -local_190[2];
  local_160[1] = 0.0;
  local_160[2] = dVar3;
  pdVar4 = local_b8;
  do {
    dVar3 = local_160[lVar7 * 3 + 3];
    dVar1 = local_160[lVar7 * 3 + 4];
    dVar2 = local_160[lVar7 * 3 + 5];
    lVar6 = 0;
    do {
      pdVar4[lVar6] =
           local_160[lVar6] * dVar2 + local_190[lVar6] * dVar3 + (double)(&local_178)[lVar6] * dVar1
      ;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar7 = lVar7 + 1;
    pdVar4 = pdVar4 + 3;
  } while (lVar7 != 3);
  pRVar5 = local_70;
  lVar7 = 0;
  do {
    dVar3 = local_b8[lVar7 * 3 + -9];
    dVar1 = local_b8[lVar7 * 3 + -8];
    dVar2 = local_b8[lVar7 * 3 + -7];
    lVar6 = 0;
    do {
      pRVar5[lVar6] =
           local_b8[lVar6 + 6] * dVar2 + local_b8[lVar6] * dVar3 + local_b8[lVar6 + 3] * dVar1;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar7 = lVar7 + 1;
    pRVar5 = pRVar5 + 3;
  } while (lVar7 != 3);
  pRVar5 = local_70;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    this->m[0][0] = *pRVar5;
    pRVar5 = pRVar5 + (ulong)bVar8 * -2 + 1;
    this = (Matrix3 *)((long)this + ((ulong)bVar8 * -2 + 1) * 8);
  }
  return;
}

Assistant:

void Matrix3::fromEulerAnglesXZY ( const Real& fYAngle_radian, const Real& fPAngle_radian,
                                           const Real& fRAngle_radian )
        {
            Real fCos, fSin;

            fCos = cos( fYAngle_radian );
            fSin = sin( fYAngle_radian );
            Matrix3 kXMat( 1.0, 0.0, 0.0, 0.0, fCos, -fSin, 0.0, fSin, fCos );

            fCos = cos( fPAngle_radian );
            fSin = sin( fPAngle_radian );
            Matrix3 kZMat( fCos, -fSin, 0.0, fSin, fCos, 0.0, 0.0, 0.0, 1.0 );

            fCos = cos( fRAngle_radian );
            fSin = sin( fRAngle_radian );
            Matrix3 kYMat( fCos, 0.0, fSin, 0.0, 1.0, 0.0, -fSin, 0.0, fCos );

            *this = kXMat * ( kZMat * kYMat );
        }